

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O3

void __thiscall sfc::Image::save_scaled(Image *this,string *path,Mode mode)

{
  _Alloc_hider _Var1;
  size_type sVar2;
  rgba_t rVar3;
  uint uVar4;
  runtime_error *this_00;
  char *pcVar5;
  uint uVar6;
  ulong uVar7;
  rgba_t *color;
  pointer puVar8;
  _Alloc_hider _Var9;
  rgba_vec_t vc_1;
  rgba_vec_t vc;
  byte_vec_t scaled_data;
  allocator_type local_91;
  string local_90;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_70;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  rgba_vec_t local_40;
  
  to_rgba(&local_40,&this->_data);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_70,&local_40);
  for (puVar8 = local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar8 != local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish; puVar8 = puVar8 + 1) {
    rVar3 = reduce_color(*puVar8,mode);
    *puVar8 = rVar3;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_90,&local_70);
  sVar2 = local_90._M_string_length;
  _Var1._M_p = local_90._M_dataplus._M_p;
  for (_Var9._M_p = local_90._M_dataplus._M_p; _Var9._M_p != (pointer)sVar2;
      _Var9._M_p = _Var9._M_p + 4) {
    rVar3 = normalize_color(*(rgba_t *)_Var9._M_p,mode);
    *(rgba_t *)_Var9._M_p = rVar3;
    _Var1._M_p = (pointer)local_90._M_string_length;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_58,(long)_Var1._M_p - (long)local_90._M_dataplus._M_p,&local_91);
  if ((pointer)local_90._M_string_length != local_90._M_dataplus._M_p) {
    uVar4 = 1;
    uVar6 = 3;
    uVar7 = 0;
    do {
      local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[uVar6 - 3] = local_90._M_dataplus._M_p[uVar7 * 4];
      local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[uVar6 - 2] = local_90._M_dataplus._M_p[uVar7 * 4 + 1];
      local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[uVar6 - 1] = local_90._M_dataplus._M_p[uVar7 * 4 + 2];
      local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[uVar6] = local_90._M_dataplus._M_p[uVar7 * 4 + 3];
      uVar7 = (ulong)uVar4;
      uVar4 = uVar4 + 1;
      uVar6 = uVar6 + 4;
    } while (uVar7 < (ulong)((long)(local_90._M_string_length - (long)local_90._M_dataplus._M_p) >>
                            2));
  }
  if ((rgba_t *)local_90._M_dataplus._M_p != (rgba_t *)0x0) {
    operator_delete(local_90._M_dataplus._M_p,
                    local_90.field_2._M_allocated_capacity - (long)local_90._M_dataplus._M_p);
  }
  if (local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (rgba_t *)0x0) {
    operator_delete(local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,(path->_M_dataplus)._M_p,(allocator<char> *)&local_70);
  uVar4 = lodepng::encode(&local_90,&local_58,this->_width,this->_height,LCT_RGBA,8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (uVar4 == 0) {
    if (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_58.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_58.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  pcVar5 = lodepng_error_text(uVar4);
  std::runtime_error::runtime_error(this_00,pcVar5);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Image::save_scaled(const std::string& path, Mode mode) {
  auto scaled_data = to_bytes(normalize_colors(reduce_colors(rgba_data(), mode), mode));
  unsigned error = lodepng::encode(path.c_str(), scaled_data, _width, _height, LCT_RGBA, 8);
  if (error)
    throw std::runtime_error(lodepng_error_text(error));
}